

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

void Dtt_EnumerateLf(int nVars,int nNodeMax,int fDelay,int fMulti,int fVerbose,char *pFileName)

{
  int FanJ;
  Vec_Wec_t *pVVar1;
  word *pwVar2;
  Vec_Int_t *vFuns;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Dtt_Man_t *p;
  Vec_Int_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint Truth;
  word nMultis;
  uint Truth_00;
  uint Truth_01;
  int iVar11;
  uint Truth_02;
  ulong uVar12;
  long lVar13;
  word nSteps;
  long lVar14;
  ulong uVar15;
  timespec ts;
  abctime local_a8;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_a8 = -1;
  }
  else {
    local_a8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p = Dtt_ManAlloc(nVars,fMulti);
  pVVar7 = p->vFanins;
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(p->vTruths,0);
  Vec_IntPush(p->vConfigs,0);
  Vec_IntPush(p->vClasses,p->vTruthNpns->nSize);
  Vec_IntPush(p->vTruthNpns,0);
  *p->pPres = *p->pPres | 1;
  pVVar1 = p->vFunNodes;
  iVar3 = p->vFanins->nSize;
  if (pVVar1->nSize < 1) {
    uVar4 = pVVar1->nSize * 2;
    uVar12 = 1;
    if (1 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
    }
    iVar11 = (int)uVar12;
    if (pVVar1->nCap < iVar11) {
      if (pVVar1->pArray == (Vec_Int_t *)0x0) {
        pVVar7 = (Vec_Int_t *)malloc(uVar12 << 4);
      }
      else {
        pVVar7 = (Vec_Int_t *)realloc(pVVar1->pArray,uVar12 << 4);
      }
      pVVar1->pArray = pVVar7;
      memset(pVVar7 + pVVar1->nCap,0,((long)iVar11 - (long)pVVar1->nCap) * 0x10);
      pVVar1->nCap = iVar11;
    }
    pVVar1->nSize = 1;
  }
  if (pVVar1->nSize < 1) {
LAB_0051dfa9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  Vec_IntPush(pVVar1->pArray,iVar3 / 2);
  pVVar7 = p->vFanins;
  lVar13 = 0;
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(pVVar7,0);
  Vec_IntPush(p->vTruths,-0x55555556);
  Vec_IntPush(p->vConfigs,0);
  Vec_IntPush(p->vClasses,p->vTruthNpns->nSize);
  Vec_IntPush(p->vTruthNpns,-0x55555556);
  if (0 < nVars) {
    uVar4 = p->CmpMask;
    pwVar2 = p->pPres;
    uVar5 = p->FunMask;
    do {
      uVar8 = (-(uint)((uVar4 & *(uint *)((long)s_Truths6 + lVar13)) != 0) ^
              *(uint *)((long)s_Truths6 + lVar13)) & uVar5;
      pwVar2[(int)uVar8 >> 6] = pwVar2[(int)uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
      lVar13 = lVar13 + 8;
    } while ((ulong)(uint)nVars << 3 != lVar13);
  }
  p->Counts[0] = 2;
  nSteps = 0;
  Dtt_PrintStats(0,nVars,p->vFunNodes,0,local_a8,fDelay,0);
  if (0 < nNodeMax) {
    uVar12 = 1;
    nMultis = 0;
    do {
      iVar3 = (int)uVar12;
      uVar4 = iVar3 - 1;
      uVar15 = 0;
      do {
        if ((long)uVar15 <= (long)(int)uVar4) {
          iVar11 = p->vFunNodes->nSize;
          if (((long)iVar11 <= (long)uVar15) || (iVar11 <= (int)uVar4)) goto LAB_0051dfa9;
          pVVar7 = p->vFunNodes->pArray;
          if (0 < pVVar7[uVar15].nSize) {
            uVar10 = (ulong)uVar4;
            lVar13 = 0;
            do {
              iVar11 = pVVar7[uVar15].pArray[lVar13];
              if (((long)iVar11 < 0) || (p->vTruths->nSize <= iVar11)) {
LAB_0051df8a:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              vFuns = p->vTemp;
              Dtt_ManCollect(p,p->vTruths->pArray[iVar11],vFuns);
              uVar5 = 0;
              if (uVar15 == uVar10) {
                uVar5 = (uint)lVar13;
              }
              if ((int)uVar5 < pVVar7[uVar10].nSize) {
                uVar9 = (ulong)uVar5;
                do {
                  FanJ = pVVar7[uVar10].pArray[uVar9];
                  if (((long)FanJ < 0) || (p->vTruths->nSize <= FanJ)) goto LAB_0051df8a;
                  if (0 < vFuns->nSize) {
                    uVar5 = p->vTruths->pArray[FanJ];
                    lVar14 = 0;
                    do {
                      uVar8 = vFuns->pArray[lVar14];
                      Truth_00 = uVar8 & uVar5;
                      uVar6 = (-(uint)((p->CmpMask & Truth_00) != 0) ^ Truth_00) & p->FunMask;
                      if ((p->pPres[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0051dae0:
                        Dtt_ManAddFunction(p,iVar3,iVar11,FanJ,0,Truth_00);
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar6 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar6) goto LAB_0051df4c;
                        if ((long)uVar12 <= (long)p->pNodes[uVar6]) {
                          if (uVar12 != (uint)p->pNodes[uVar6]) goto LAB_0051df6b;
                          if (p->pVisited[uVar6] == '\0') goto LAB_0051dae0;
                        }
                      }
                      Truth_01 = ~uVar8 & uVar5;
                      uVar6 = (-(uint)((p->CmpMask & Truth_01) != 0) ^ Truth_01) & p->FunMask;
                      if ((p->pPres[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0051db82:
                        Dtt_ManAddFunction(p,iVar3,iVar11,FanJ,1,Truth_01);
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar6 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar6) goto LAB_0051df4c;
                        if ((long)uVar12 <= (long)p->pNodes[uVar6]) {
                          if (uVar12 != (uint)p->pNodes[uVar6]) goto LAB_0051df6b;
                          if (p->pVisited[uVar6] == '\0') goto LAB_0051db82;
                        }
                      }
                      Truth = uVar8 & ~uVar5;
                      uVar6 = (-(uint)((p->CmpMask & Truth) != 0) ^ Truth) & p->FunMask;
                      if ((p->pPres[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0051dc21:
                        Dtt_ManAddFunction(p,iVar3,iVar11,FanJ,2,Truth);
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar6 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar6) goto LAB_0051df4c;
                        if ((long)uVar12 <= (long)p->pNodes[uVar6]) {
                          if (uVar12 != (uint)p->pNodes[uVar6]) goto LAB_0051df6b;
                          if (p->pVisited[uVar6] == '\0') goto LAB_0051dc21;
                        }
                      }
                      Truth_02 = uVar8 | uVar5;
                      uVar6 = (-(uint)((p->CmpMask & Truth_02) != 0) ^ Truth_02) & p->FunMask;
                      if ((p->pPres[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0051dcce:
                        Dtt_ManAddFunction(p,iVar3,iVar11,FanJ,3,Truth_02);
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar6 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar6) goto LAB_0051df4c;
                        if ((long)uVar12 <= (long)p->pNodes[uVar6]) {
                          if (uVar12 != (uint)p->pNodes[uVar6]) goto LAB_0051df6b;
                          if (p->pVisited[uVar6] == '\0') goto LAB_0051dcce;
                        }
                      }
                      uVar8 = uVar8 ^ uVar5;
                      uVar6 = (-(uint)((p->CmpMask & uVar8) != 0) ^ uVar8) & p->FunMask;
                      if ((p->pPres[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
LAB_0051dd70:
                        Dtt_ManAddFunction(p,iVar3,iVar11,FanJ,4,uVar8);
                      }
                      else if (p->pTable != (uint *)0x0) {
                        uVar6 = p->pTable[uVar6];
                        if ((uint)p->nClasses <= uVar6) {
LAB_0051df4c:
                          __assert_fail("Class < (unsigned)p->nClasses",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                                        ,0x219,"int Dtt_ManGetFun(Dtt_Man_t *, unsigned int, int)");
                        }
                        if ((long)uVar12 <= (long)p->pNodes[uVar6]) {
                          if (uVar12 != (uint)p->pNodes[uVar6]) {
LAB_0051df6b:
                            __assert_fail("p->pNodes[Class] == n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                                          ,0x21c,"int Dtt_ManGetFun(Dtt_Man_t *, unsigned int, int)"
                                         );
                          }
                          if (p->pVisited[uVar6] == '\0') goto LAB_0051dd70;
                        }
                      }
                      if (p->pTable != (uint *)0x0) {
                        Dtt_ManAddVisited(p,Truth_00,iVar3);
                      }
                      if (p->pTable != (uint *)0x0) {
                        Dtt_ManAddVisited(p,Truth_01,iVar3);
                      }
                      if (p->pTable != (uint *)0x0) {
                        Dtt_ManAddVisited(p,Truth,iVar3);
                      }
                      if (p->pTable != (uint *)0x0) {
                        Dtt_ManAddVisited(p,Truth_02,iVar3);
                      }
                      if (p->pTable != (uint *)0x0) {
                        Dtt_ManAddVisited(p,uVar8,iVar3);
                      }
                      lVar14 = lVar14 + 1;
                      nSteps = nSteps + 5;
                    } while (lVar14 < vFuns->nSize);
                  }
                  if (p->pTable != (uint *)0x0) {
                    Dtt_ManProcessVisited(p);
                  }
                  nMultis = nMultis + 1;
                  uVar9 = uVar9 + 1;
                } while ((int)uVar9 < pVVar7[uVar10].nSize);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pVVar7[uVar15].nSize);
          }
        }
        uVar15 = uVar15 + 1;
        uVar4 = uVar4 + fDelay + -1;
      } while (uVar15 != uVar12);
      iVar3 = Dtt_PrintStats(iVar3,nVars,p->vFunNodes,nSteps,local_a8,fDelay,nMultis);
    } while ((iVar3 != 0) && (uVar12 = uVar12 + 1, uVar12 != nNodeMax + 1));
  }
  if (fDelay != 0) {
    Dtt_PrintDistrib(p);
  }
  if (pFileName != (char *)0x0 && fDelay == 0) {
    Dtt_DumpLibrary(p,pFileName);
  }
  Dtt_ManFree(p);
  return;
}

Assistant:

void Dtt_EnumerateLf( int nVars, int nNodeMax, int fDelay, int fMulti, int fVerbose, char* pFileName )
{
    abctime clk = Abc_Clock(); word nSteps = 0, nMultis = 0;
    Dtt_Man_t * p = Dtt_ManAlloc( nVars, fMulti ); int n, i, j;

    // constant zero class
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, 0 );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, 0 );
    Dtt_ManSetFun( p, 0 );
    // buffer class
    Vec_WecPush( p->vFunNodes, 0, Vec_IntSize(p->vFanins)/2 );
    Vec_IntPushTwo( p->vFanins, 0, 0 );
    Vec_IntPush( p->vTruths, (unsigned)s_Truths6[0] );
    Vec_IntPush( p->vConfigs, 0 );
    Vec_IntPush( p->vClasses, Vec_IntSize(p->vTruthNpns) );
    Vec_IntPush( p->vTruthNpns, (unsigned)s_Truths6[0] );
    for ( i = 0; i < nVars; i++ )
        Dtt_ManSetFun( p, (unsigned)s_Truths6[i] );
    p->Counts[0] = 2;
    // enumerate
    Dtt_PrintStats(0, nVars, p->vFunNodes, nSteps, clk, fDelay, 0);
    for ( n = 1; n <= nNodeMax; n++ )
    {
        for ( i = 0, j = n - 1; i < n; i++, j = j - 1 + fDelay ) if ( i <= j )
        {
            Vec_Int_t * vFaninI = Vec_WecEntry( p->vFunNodes, i );
            Vec_Int_t * vFaninJ = Vec_WecEntry( p->vFunNodes, j );
            int k, i0, j0, EntryI, EntryJ;
            Vec_IntForEachEntry( vFaninI, EntryI, i0 )
            {
                unsigned TruthI = Vec_IntEntry(p->vTruths, EntryI);
                Vec_Int_t * vFuns = Dtt_ManCollect( p, TruthI, p->vTemp );
                int Start = i == j ? i0 : 0;
                Vec_IntForEachEntryStart( vFaninJ, EntryJ, j0, Start )
                {
                    unsigned Truth, TruthJ = Vec_IntEntry(p->vTruths, EntryJ);
                    Vec_IntForEachEntry( vFuns, Truth, k )
                    {
                        if ( !Dtt_ManGetFun(p,  TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 0,  TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ & ~Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 1,  TruthJ & ~Truth );
                        if ( !Dtt_ManGetFun(p, ~TruthJ &  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 2, ~TruthJ &  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ |  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 3,  TruthJ |  Truth );
                        if ( !Dtt_ManGetFun(p,  TruthJ ^  Truth, n) )
                            Dtt_ManAddFunction( p, n, EntryI, EntryJ, 4,  TruthJ ^  Truth );
                        nSteps += 5;

                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ & ~Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p, ~TruthJ &  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ |  Truth, n );
                        if ( p->pTable ) Dtt_ManAddVisited( p,  TruthJ ^  Truth, n );
                    }
                    nMultis++;
                    if ( p->pTable ) Dtt_ManProcessVisited( p );
                }
            }
        }
        if ( Dtt_PrintStats(n, nVars, p->vFunNodes, nSteps, clk, fDelay, nMultis) == 0 )
            break;
    }
    if ( fDelay )
        Dtt_PrintDistrib( p );
    //if ( p->pTable ) 
        //Dtt_PrintMulti( p );
    if ( !fDelay && pFileName!=NULL )
        Dtt_DumpLibrary( p, pFileName );
    Dtt_ManFree( p );
}